

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void print_hex(char *name,uchar *s,int slen)

{
  size_t sVar1;
  uint8_t *out;
  int in_EDX;
  uint8_t *in_RSI;
  char *in_RDI;
  int i_1;
  uchar *hex;
  int i;
  int local_24;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    sVar1 = strlen(in_RDI);
    if (sVar1 <= (ulong)(long)local_18) break;
    printf("%c",(ulong)(uint)(int)in_RDI[local_18]);
    local_18 = local_18 + 1;
  }
  out = (uint8_t *)malloc((long)(in_EDX << 1));
  u8_to_hex(in_RSI,in_EDX,out);
  for (local_24 = 0; SBORROW4(local_24,in_EDX * 2) != local_24 + in_EDX * -2 < 0;
      local_24 = local_24 + 1) {
    printf("%c",(ulong)out[local_24]);
  }
  printf("\n");
  free(out);
  return;
}

Assistant:

void print_hex(const char *name, unsigned char *s, int slen)
{
    for(int i = 0; i < strlen(name); i++)
        printf("%c", name[i]);
    unsigned char *hex = (unsigned char*)malloc(2*slen);
    u8_to_hex(s, slen, hex);
    for(int i = 0; i < 2*slen; i++)
        printf("%c", hex[i]);
    printf("\n");
    free(hex);
}